

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

cf_errno_t
cf_thread_create(cf_thread_t *t,cf_thread_attr_t *attr,cf_thread_proc_t proc,cf_void_t *arg)

{
  int iVar1;
  
  iVar1 = pthread_create(t,(pthread_attr_t *)attr,(__start_routine *)proc,arg);
  return (cf_errno_t)(iVar1 != 0);
}

Assistant:

cf_errno_t cf_thread_create(cf_thread_t* t, cf_thread_attr_t* attr,
                            cf_thread_proc_t proc, cf_void_t* arg) {
#ifdef CF_OS_WIN
    unsigned long tid;
    *t = CreateThread(NULL, 0, (LPTHREAD_START_ROUTINE)proc, arg, 0, &tid);
    if (*t == NULL) return CF_NOK;
    else return CF_OK;
#else
    if(pthread_create(t, attr, proc, arg) == 0) return CF_OK;
    else return CF_NOK;
#endif
}